

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O3

llama_memory_i * __thiscall llama_model::create_memory(llama_model *this)

{
  llama_kv_cache_unified *this_00;
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  if ((this->arch - LLM_ARCH_RWKV6 < 4) || (this->arch == LLM_ARCH_MAMBA)) {
    this_00 = (llama_kv_cache_unified *)operator_new(0xf8);
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    local_48 = (code *)0x0;
    uStack_40 = 0;
    llama_kv_cache_unified::llama_kv_cache_unified(this_00,&this->hparams,(callbacks *)&local_58);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
  }
  else {
    this_00 = (llama_kv_cache_unified *)operator_new(0xf8);
    local_30._8_8_ = 0;
    local_18 = std::
               _Function_handler<ggml_tensor_*(unsigned_int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp:12784:45)>
               ::_M_invoke;
    local_20 = std::
               _Function_handler<ggml_tensor_*(unsigned_int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp:12784:45)>
               ::_M_manager;
    local_30._M_unused._M_object = this;
    llama_kv_cache_unified::llama_kv_cache_unified(this_00,&this->hparams,(callbacks *)&local_30);
    if (local_20 != (code *)0x0) {
      (*local_20)(&local_30,&local_30,__destroy_functor);
    }
  }
  return (llama_memory_i *)this_00;
}

Assistant:

llama_memory_i * llama_model::create_memory() const {
    llama_memory_i * res;

    switch (arch) {
        case LLM_ARCH_MAMBA:
        case LLM_ARCH_RWKV6:
        case LLM_ARCH_RWKV6QWEN2:
        case LLM_ARCH_RWKV7:
        case LLM_ARCH_ARWKV7:
            {
                res = new llama_kv_cache_unified(hparams, {
                    /*.get_rope_factors =*/ nullptr
                });
            } break;
        default:
            {
                res = new llama_kv_cache_unified(hparams, {
                    /*.get_rope_factors =*/ [this](uint32_t n_ctx_per_seq, int il) {
                        // choose long/short freq factors based on the context size
                        if (layers[il].rope_freqs != nullptr) {
                            return layers[il].rope_freqs;
                        }

                        if (n_ctx_per_seq > hparams.n_ctx_orig_yarn) {
                            return layers[il].rope_long;
                        }

                        return layers[il].rope_short;
                    }
                });
            }
    }

    return res;
}